

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O1

void kokkosp_begin_deep_copy
               (SpaceHandle dst_handle,char *dst_name,void *dst_ptr,SpaceHandle src_handle,
               char *src_name,void *src_ptr,uint64_t size)

{
  anon_class_8_1_dda845c3 local_f0;
  uint64_t local_e8;
  void *local_e0;
  char *local_d8;
  void *local_d0;
  char *local_c8;
  anon_class_56_7_af1e77c7 local_c0;
  SpaceHandle local_88;
  SpaceHandle local_48;
  
  local_c0.dst_handle = &local_88;
  local_88.name[0x30] = dst_handle.name[0x30];
  local_88.name[0x31] = dst_handle.name[0x31];
  local_88.name[0x32] = dst_handle.name[0x32];
  local_88.name[0x33] = dst_handle.name[0x33];
  local_88.name[0x34] = dst_handle.name[0x34];
  local_88.name[0x35] = dst_handle.name[0x35];
  local_88.name[0x36] = dst_handle.name[0x36];
  local_88.name[0x37] = dst_handle.name[0x37];
  local_88.name[0x38] = dst_handle.name[0x38];
  local_88.name[0x39] = dst_handle.name[0x39];
  local_88.name[0x3a] = dst_handle.name[0x3a];
  local_88.name[0x3b] = dst_handle.name[0x3b];
  local_88.name[0x3c] = dst_handle.name[0x3c];
  local_88.name[0x3d] = dst_handle.name[0x3d];
  local_88.name[0x3e] = dst_handle.name[0x3e];
  local_88.name[0x3f] = dst_handle.name[0x3f];
  local_88.name[0x20] = dst_handle.name[0x20];
  local_88.name[0x21] = dst_handle.name[0x21];
  local_88.name[0x22] = dst_handle.name[0x22];
  local_88.name[0x23] = dst_handle.name[0x23];
  local_88.name[0x24] = dst_handle.name[0x24];
  local_88.name[0x25] = dst_handle.name[0x25];
  local_88.name[0x26] = dst_handle.name[0x26];
  local_88.name[0x27] = dst_handle.name[0x27];
  local_88.name[0x28] = dst_handle.name[0x28];
  local_88.name[0x29] = dst_handle.name[0x29];
  local_88.name[0x2a] = dst_handle.name[0x2a];
  local_88.name[0x2b] = dst_handle.name[0x2b];
  local_88.name[0x2c] = dst_handle.name[0x2c];
  local_88.name[0x2d] = dst_handle.name[0x2d];
  local_88.name[0x2e] = dst_handle.name[0x2e];
  local_88.name[0x2f] = dst_handle.name[0x2f];
  local_88.name[0x10] = dst_handle.name[0x10];
  local_88.name[0x11] = dst_handle.name[0x11];
  local_88.name[0x12] = dst_handle.name[0x12];
  local_88.name[0x13] = dst_handle.name[0x13];
  local_88.name[0x14] = dst_handle.name[0x14];
  local_88.name[0x15] = dst_handle.name[0x15];
  local_88.name[0x16] = dst_handle.name[0x16];
  local_88.name[0x17] = dst_handle.name[0x17];
  local_88.name[0x18] = dst_handle.name[0x18];
  local_88.name[0x19] = dst_handle.name[0x19];
  local_88.name[0x1a] = dst_handle.name[0x1a];
  local_88.name[0x1b] = dst_handle.name[0x1b];
  local_88.name[0x1c] = dst_handle.name[0x1c];
  local_88.name[0x1d] = dst_handle.name[0x1d];
  local_88.name[0x1e] = dst_handle.name[0x1e];
  local_88.name[0x1f] = dst_handle.name[0x1f];
  local_88.name[0] = dst_handle.name[0];
  local_88.name[1] = dst_handle.name[1];
  local_88.name[2] = dst_handle.name[2];
  local_88.name[3] = dst_handle.name[3];
  local_88.name[4] = dst_handle.name[4];
  local_88.name[5] = dst_handle.name[5];
  local_88.name[6] = dst_handle.name[6];
  local_88.name[7] = dst_handle.name[7];
  local_88.name[8] = dst_handle.name[8];
  local_88.name[9] = dst_handle.name[9];
  local_88.name[10] = dst_handle.name[10];
  local_88.name[0xb] = dst_handle.name[0xb];
  local_88.name[0xc] = dst_handle.name[0xc];
  local_88.name[0xd] = dst_handle.name[0xd];
  local_88.name[0xe] = dst_handle.name[0xe];
  local_88.name[0xf] = dst_handle.name[0xf];
  local_c0.src_handle = &local_48;
  local_48.name[0x30] = src_handle.name[0x30];
  local_48.name[0x31] = src_handle.name[0x31];
  local_48.name[0x32] = src_handle.name[0x32];
  local_48.name[0x33] = src_handle.name[0x33];
  local_48.name[0x34] = src_handle.name[0x34];
  local_48.name[0x35] = src_handle.name[0x35];
  local_48.name[0x36] = src_handle.name[0x36];
  local_48.name[0x37] = src_handle.name[0x37];
  local_48.name[0x38] = src_handle.name[0x38];
  local_48.name[0x39] = src_handle.name[0x39];
  local_48.name[0x3a] = src_handle.name[0x3a];
  local_48.name[0x3b] = src_handle.name[0x3b];
  local_48.name[0x3c] = src_handle.name[0x3c];
  local_48.name[0x3d] = src_handle.name[0x3d];
  local_48.name[0x3e] = src_handle.name[0x3e];
  local_48.name[0x3f] = src_handle.name[0x3f];
  local_48.name[0x20] = src_handle.name[0x20];
  local_48.name[0x21] = src_handle.name[0x21];
  local_48.name[0x22] = src_handle.name[0x22];
  local_48.name[0x23] = src_handle.name[0x23];
  local_48.name[0x24] = src_handle.name[0x24];
  local_48.name[0x25] = src_handle.name[0x25];
  local_48.name[0x26] = src_handle.name[0x26];
  local_48.name[0x27] = src_handle.name[0x27];
  local_48.name[0x28] = src_handle.name[0x28];
  local_48.name[0x29] = src_handle.name[0x29];
  local_48.name[0x2a] = src_handle.name[0x2a];
  local_48.name[0x2b] = src_handle.name[0x2b];
  local_48.name[0x2c] = src_handle.name[0x2c];
  local_48.name[0x2d] = src_handle.name[0x2d];
  local_48.name[0x2e] = src_handle.name[0x2e];
  local_48.name[0x2f] = src_handle.name[0x2f];
  local_48.name[0x10] = src_handle.name[0x10];
  local_48.name[0x11] = src_handle.name[0x11];
  local_48.name[0x12] = src_handle.name[0x12];
  local_48.name[0x13] = src_handle.name[0x13];
  local_48.name[0x14] = src_handle.name[0x14];
  local_48.name[0x15] = src_handle.name[0x15];
  local_48.name[0x16] = src_handle.name[0x16];
  local_48.name[0x17] = src_handle.name[0x17];
  local_48.name[0x18] = src_handle.name[0x18];
  local_48.name[0x19] = src_handle.name[0x19];
  local_48.name[0x1a] = src_handle.name[0x1a];
  local_48.name[0x1b] = src_handle.name[0x1b];
  local_48.name[0x1c] = src_handle.name[0x1c];
  local_48.name[0x1d] = src_handle.name[0x1d];
  local_48.name[0x1e] = src_handle.name[0x1e];
  local_48.name[0x1f] = src_handle.name[0x1f];
  local_48.name[0] = src_handle.name[0];
  local_48.name[1] = src_handle.name[1];
  local_48.name[2] = src_handle.name[2];
  local_48.name[3] = src_handle.name[3];
  local_48.name[4] = src_handle.name[4];
  local_48.name[5] = src_handle.name[5];
  local_48.name[6] = src_handle.name[6];
  local_48.name[7] = src_handle.name[7];
  local_48.name[8] = src_handle.name[8];
  local_48.name[9] = src_handle.name[9];
  local_48.name[10] = src_handle.name[10];
  local_48.name[0xb] = src_handle.name[0xb];
  local_48.name[0xc] = src_handle.name[0xc];
  local_48.name[0xd] = src_handle.name[0xd];
  local_48.name[0xe] = src_handle.name[0xe];
  local_48.name[0xf] = src_handle.name[0xf];
  local_c0.dst_name = &local_c8;
  local_c0.dst_ptr = &local_d0;
  local_c0.src_name = &local_d8;
  local_c0.src_ptr = &local_e0;
  local_c0.size = &local_e8;
  local_f0.callback = &local_c0;
  if (DAT_003d6f8d != 0) {
    local_e8 = size;
    local_e0 = src_ptr;
    local_d8 = src_name;
    local_d0 = dst_ptr;
    local_c8 = dst_name;
    perfetto::internal::
    TrackEventDataSource<perfetto::TrackEvent,_&perfetto::internal::kCategoryRegistry>::
    CallIfCategoryEnabled<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/libperfetto-connector.cpp:210:3)>
    ::anon_class_8_1_dda845c3::operator()(&local_f0,(uint)DAT_003d6f8d);
  }
  return;
}

Assistant:

void kokkosp_begin_deep_copy(SpaceHandle dst_handle, const char *dst_name,
                             const void *dst_ptr, SpaceHandle src_handle,
                             const char *src_name, const void *src_ptr,
                             uint64_t size) {
  TRACE_EVENT_BEGIN("kokkos.deep_copy", nullptr,
                    [&](perfetto::EventContext ctx) {
                      std::stringstream _name;
                      _name << dst_name << "->" << src_name;
                      ctx.event()->set_name(_name.str());
                      add_annotation(ctx, "size", size);
                      add_annotation(ctx, "dest_type", dst_handle.name);
                      add_annotation(ctx, "src_type", src_handle.name);
                      add_annotation(ctx, "dest_address", dst_ptr);
                      add_annotation(ctx, "src_address", src_ptr);
                    });
}